

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_50b73::GetSourcedv
          (anon_unknown_dwarf_50b73 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<double,_18446744073709551615UL> values)

{
  BufferStorage **ppBVar1;
  char cVar2;
  ALCdevice *device;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  bool bVar11;
  ALuint AVar12;
  uint uVar13;
  Voice *pVVar14;
  uint uVar15;
  undefined4 in_register_0000000c;
  undefined1 (*pauVar16) [16];
  __pointer_type pBVar17;
  ALCcontext *Context_00;
  __int_type _Var18;
  BufferStorage *this_00;
  pointer pdVar19;
  int iVar20;
  nanoseconds nVar21;
  nanoseconds nVar22;
  span<int,_18446744073709551615UL> values_00;
  ClockLatency CVar23;
  undefined8 uStack_60;
  nanoseconds srcclock;
  int ivals [6];
  
  pauVar16 = (undefined1 (*) [16])CONCAT44(in_register_0000000c,prop);
  pdVar19 = values.mData;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  device = *(ALCdevice **)&Source[1].mDistanceModel;
  iVar20 = (int)Context;
  switch(iVar20) {
  case 0x1001:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x14);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1001;
    break;
  case 0x1002:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x18);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1002;
    break;
  case 0x1003:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)this;
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1003;
    break;
  case 0x1004:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x28) >> 0x20);
      auVar9._8_4_ = SUB84(dVar10,0);
      auVar9._0_8_ = (double)(float)*(undefined8 *)(this + 0x28);
      auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *pauVar16 = auVar9;
      dVar10 = (double)*(float *)(this + 0x30);
LAB_00122fa7:
      *(double *)pauVar16[1] = dVar10;
      return true;
    }
    uStack_60 = 3;
    Context_00 = (ALCcontext *)0x1004;
    break;
  case 0x1005:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x40) >> 0x20);
      auVar8._8_4_ = SUB84(dVar10,0);
      auVar8._0_8_ = (double)(float)*(undefined8 *)(this + 0x40);
      auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *pauVar16 = auVar8;
      dVar10 = (double)*(float *)(this + 0x48);
      goto LAB_00122fa7;
    }
    uStack_60 = 3;
    Context_00 = (ALCcontext *)0x1005;
    break;
  case 0x1006:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x3) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x34) >> 0x20);
      auVar7._8_4_ = SUB84(dVar10,0);
      auVar7._0_8_ = (double)(float)*(undefined8 *)(this + 0x34);
      auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *pauVar16 = auVar7;
      dVar10 = (double)*(float *)(this + 0x3c);
      goto LAB_00122fa7;
    }
    uStack_60 = 3;
    Context_00 = (ALCcontext *)0x1006;
    break;
  case 0x1007:
  case 0x1010:
  case 0x1015:
  case 0x1016:
  case 0x1027:
  case 0x1033:
    goto switchD_00122c87_caseD_1007;
  case 0x1008:
  case 0x1009:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1032:
switchD_00122c87_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Invalid source double property 0x%04x",Context_00);
    return false;
  case 0x100a:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 4);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x100a;
    break;
  case 0x100d:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0xc);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x100d;
    break;
  case 0x100e:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x10);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x100e;
    break;
  case 0x100f:
    if ((long)pdVar19 - (long)pauVar16 == 0x30) {
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x4c) >> 0x20);
      auVar4._8_4_ = SUB84(dVar10,0);
      auVar4._0_8_ = (double)(float)*(undefined8 *)(this + 0x4c);
      auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *pauVar16 = auVar4;
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x54) >> 0x20);
      auVar5._8_4_ = SUB84(dVar10,0);
      auVar5._0_8_ = (double)(float)*(undefined8 *)(this + 0x54);
      auVar5._12_4_ = (int)((ulong)dVar10 >> 0x20);
      pauVar16[1] = auVar5;
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x5c) >> 0x20);
      auVar6._8_4_ = SUB84(dVar10,0);
      auVar6._0_8_ = (double)(float)*(undefined8 *)(this + 0x5c);
      auVar6._12_4_ = (int)((ulong)dVar10 >> 0x20);
      pauVar16[2] = auVar6;
      return true;
    }
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    uStack_60 = 6;
    Context_00 = (ALCcontext *)0x100f;
    break;
  case 0x1020:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x1c);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1020;
    break;
  case 0x1021:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x24);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1021;
    break;
  case 0x1022:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 8);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1022;
    break;
  case 0x1023:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x20);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1023;
    break;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      do {
        while( true ) {
          AVar12 = ALCdevice::waitForMix(device);
          pVVar14 = GetSourceVoice((ALsource *)this,(ALCcontext *)Source);
          if (pVVar14 == (Voice *)0x0) break;
          _Var18 = (pVVar14->mPosition).super___atomic_base<unsigned_int>._M_i;
          uVar15 = (pVVar14->mPositionFrac).super___atomic_base<unsigned_int>._M_i;
          if (AVar12 == (device->MixCount).super___atomic_base<unsigned_int>._M_i) {
            pBVar17 = *(__pointer_type *)(this + 0x180);
            this_00 = (BufferStorage *)0x0;
            goto LAB_00122de8;
          }
        }
      } while (AVar12 != (device->MixCount).super___atomic_base<unsigned_int>._M_i);
      dVar10 = 0.0;
      goto LAB_001232a0;
    }
    goto LAB_001232ae;
  case 0x1030:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if (((ulong)values_00.mDataEnd | 4) == 6) {
      dVar10 = (double)(float)((ulong)*(undefined8 *)(this + 0x88) >> 0x20);
      auVar3._8_4_ = SUB84(dVar10,0);
      auVar3._0_8_ = (double)(float)*(undefined8 *)(this + 0x88);
      auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *pauVar16 = auVar3;
      return true;
    }
    uStack_60 = 2;
    Context_00 = (ALCcontext *)0x1030;
    break;
  case 0x1031:
    values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
    if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
      dVar10 = (double)*(float *)(this + 0x90);
      goto LAB_00122dc3;
    }
    uStack_60 = 1;
    Context_00 = (ALCcontext *)0x1031;
    break;
  default:
    switch(iVar20) {
    case 0x20007:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_60 = 1;
        Context_00 = (ALCcontext *)0x20007;
        goto LAB_00123221;
      }
      dVar10 = (double)*(float *)(this + 0x7c);
      break;
    case 0x20008:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_60 = 1;
        Context_00 = (ALCcontext *)0x20008;
        goto LAB_00123221;
      }
      dVar10 = (double)*(float *)(this + 0x80);
      break;
    case 0x20009:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
        uStack_60 = 1;
        Context_00 = (ALCcontext *)0x20009;
        goto LAB_00123221;
      }
      dVar10 = (double)*(float *)(this + 0x78);
      break;
    case 0x2000a:
    case 0x2000b:
    case 0x2000c:
      goto switchD_00122c87_caseD_1007;
    default:
      if (iVar20 != 0x202) {
        if (iVar20 == 0x1201) {
          values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
          if (((ulong)values_00.mDataEnd | 4) == 6) {
            dVar10 = GetSourceSecOffset((ALsource *)this,(ALCcontext *)Source,&srcclock);
            *(double *)*pauVar16 = dVar10;
            std::mutex::lock(&device->StateLock);
            CVar23 = GetClockLatency(device);
            nVar21 = CVar23.Latency.__r;
            pthread_mutex_unlock((pthread_mutex_t *)&device->StateLock);
            if (CVar23.ClockTime.__r.__r != srcclock.__r) {
              nVar22.__r = CVar23.ClockTime.__r.__r - srcclock.__r;
              if (nVar21.__r <= nVar22.__r) {
                nVar22.__r = nVar21.__r;
              }
              nVar21.__r = nVar21.__r - nVar22.__r;
            }
LAB_001231cc:
            *(double *)(*pauVar16 + 8) = (double)nVar21.__r / 1000000000.0;
            return true;
          }
          uStack_60 = 2;
          Context_00 = (ALCcontext *)0x1201;
          goto LAB_00123221;
        }
        if (iVar20 == 0x1203) {
          values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
          if (((ulong)values_00.mDataEnd | 4) == 6) {
            dVar10 = GetSourceSecOffset((ALsource *)this,(ALCcontext *)Source,&srcclock);
            *(double *)*pauVar16 = dVar10;
            nVar21 = srcclock;
            goto LAB_001231cc;
          }
          uStack_60 = 2;
          Context_00 = (ALCcontext *)0x1203;
          goto LAB_00123221;
        }
        if ((iVar20 != 0x1212) && (iVar20 != 0x1214)) {
          if (iVar20 == 0xc000) {
            values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
            if ((values_00.mDataEnd == (pointer)0x1) || (values_00.mDataEnd == (pointer)0x6)) {
              dVar10 = (double)*(float *)(this + 0x84);
              break;
            }
            uStack_60 = 1;
            Context_00 = (ALCcontext *)0xc000;
            goto LAB_00123221;
          }
          if (iVar20 != 0xd000) goto switchD_00122c87_caseD_1008;
        }
      }
switchD_00122c87_caseD_1007:
      values_00.mDataEnd = (pointer)((long)pdVar19 - (long)pauVar16 >> 3);
      if ((values_00.mDataEnd != (pointer)0x1) && (values_00.mDataEnd != (pointer)0x6)) {
LAB_001232ae:
        uStack_60 = 1;
        goto LAB_00123221;
      }
      values_00.mData = ivals + 1;
      bVar11 = GetSourceiv(this,Source,Context_00,(SourceProp)ivals,values_00);
      if (!bVar11) {
        return false;
      }
      dVar10 = (double)ivals[0];
    }
LAB_00122dc3:
    *(double *)*pauVar16 = dVar10;
    return true;
  }
LAB_00123221:
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uStack_60,values_00.mDataEnd);
  return false;
LAB_00122de8:
  if (pBVar17 == (__pointer_type)0x0) goto LAB_00122e0f;
  if (this_00 == (BufferStorage *)0x0) {
    this_00 = pBVar17->mBuffer;
  }
  if (pBVar17 == (pVVar14->mCurrentBuffer)._M_b._M_p) goto LAB_00122e0f;
  _Var18 = _Var18 + pBVar17->mSampleLen;
  pBVar17 = (pBVar17->mNext)._M_b._M_p;
  goto LAB_00122de8;
LAB_00122e0f:
  while ((pBVar17 != (__pointer_type)0x0 && (this_00 == (BufferStorage *)0x0))) {
    ppBVar1 = &pBVar17->mBuffer;
    pBVar17 = (pBVar17->mNext)._M_b._M_p;
    this_00 = *ppBVar1;
  }
  if (this_00 == (BufferStorage *)0x0) {
    __assert_fail("BufferFmt != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rbetik12[P]FallingSand/lib/vx-sound/lib/openal/al/source.cpp"
                  ,0x143,
                  "double (anonymous namespace)::GetSourceOffset(ALsource *, ALenum, ALCcontext *)")
    ;
  }
  if (iVar20 != 0x1026) {
    if (iVar20 == 0x1025) {
      dVar10 = (double)uVar15 * 0.000244140625 + (double)_Var18;
    }
    else {
      dVar10 = 0.0;
      if (iVar20 == 0x1024) {
        dVar10 = ((double)uVar15 * 0.000244140625 + (double)_Var18) / (double)this_00->mSampleRate;
      }
    }
    goto LAB_001232a0;
  }
  cVar2 = *(char *)((long)&this_00[1].mData.
                           super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                           super__Vector_impl_data._M_start + 4);
  if (cVar2 == -0x7f) {
    uVar15 = *(uint *)((long)&this_00[1].mData.
                              super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
    iVar20 = (uVar15 - 2 >> 1) + 7;
LAB_00123279:
    uVar13 = BufferStorage::channelsFromFmt(this_00);
    uVar15 = uVar13 * iVar20 * (_Var18 / uVar15);
  }
  else {
    if (cVar2 == -0x80) {
      uVar15 = *(uint *)((long)&this_00[1].mData.
                                super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl
                                .super__Vector_impl_data._M_finish + 4);
      iVar20 = (uVar15 - 1 >> 1) + 4;
      goto LAB_00123279;
    }
    uVar13 = BufferStorage::frameSizeFromFmt(this_00);
    uVar15 = uVar13 * _Var18;
  }
  dVar10 = (double)uVar15;
LAB_001232a0:
  *(double *)*pauVar16 = dVar10;
  return true;
}

Assistant:

bool GetSourcedv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<double> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ClockLatency clocktime;
    nanoseconds srcclock;
    int ivals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->Gain;
        return true;

    case AL_PITCH:
        CHECKSIZE(values, 1);
        values[0] = Source->Pitch;
        return true;

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxDistance;
        return true;

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RolloffFactor;
        return true;

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->RefDistance;
        return true;

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->InnerAngle;
        return true;

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterAngle;
        return true;

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MinGain;
        return true;

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxGain;
        return true;

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGain;
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        values[0] = GetSourceOffset(Source, prop, Context);
        return true;

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGainHF;
        return true;

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->AirAbsorptionFactor;
        return true;

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RoomRolloffFactor;
        return true;

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->DopplerFactor;
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        values[0] = Source->Radius;
        return true;

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        values[0] = Source->StereoPan[0];
        values[1] = Source->StereoPan[1];
        return true;

    case AL_SEC_OFFSET_LATENCY_SOFT:
        CHECKSIZE(values, 2);
        /* Get the source offset with the clock time first. Then get the clock
         * time with the device latency. Order is important.
         */
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        {
            std::lock_guard<std::mutex> _{device->StateLock};
            clocktime = GetClockLatency(device);
        }
        if(srcclock == clocktime.ClockTime)
            values[1] = static_cast<double>(clocktime.Latency.count()) / 1000000000.0;
        else
        {
            /* If the clock time incremented, reduce the latency by that much
             * since it's that much closer to the source offset it got earlier.
             */
            const nanoseconds diff{clocktime.ClockTime - srcclock};
            const nanoseconds latency{clocktime.Latency - std::min(clocktime.Latency, diff)};
            values[1] = static_cast<double>(latency.count()) / 1000000000.0;
        }
        return true;

    case AL_SEC_OFFSET_CLOCK_SOFT:
        CHECKSIZE(values, 2);
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        values[1] = static_cast<double>(srcclock.count()) / 1000000000.0;
        return true;

    case AL_POSITION:
        CHECKSIZE(values, 3);
        values[0] = Source->Position[0];
        values[1] = Source->Position[1];
        values[2] = Source->Position[2];
        return true;

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        values[0] = Source->Velocity[0];
        values[1] = Source->Velocity[1];
        values[2] = Source->Velocity[2];
        return true;

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        values[0] = Source->Direction[0];
        values[1] = Source->Direction[1];
        values[2] = Source->Direction[2];
        return true;

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        values[0] = Source->OrientAt[0];
        values[1] = Source->OrientAt[1];
        values[2] = Source->OrientAt[2];
        values[3] = Source->OrientUp[0];
        values[4] = Source->OrientUp[1];
        values[5] = Source->OrientUp[2];
        return true;

    /* 1x int */
    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
    case AL_SOURCE_TYPE:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_DISTANCE_MODEL:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if((err=GetSourceiv(Source, Context, prop, {ivals, 1u})) != false)
            values[0] = static_cast<double>(ivals[0]);
        return err;

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source double property 0x%04x", prop);
    return false;
}